

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartSat.c
# Opt level: O0

Vec_Int_t * Aig_ManPartitionLevelized(Aig_Man_t *p,int nPartSize)

{
  int iVar1;
  Vec_Vec_t *p_00;
  Vec_Int_t *p_01;
  Vec_Ptr_t *pVVar2;
  Aig_Obj_t *pObj_00;
  undefined4 local_3c;
  undefined4 local_38;
  int Counter;
  int k;
  int i;
  Aig_Obj_t *pObj;
  Vec_Vec_t *vNodes;
  Vec_Int_t *vId2Part;
  int nPartSize_local;
  Aig_Man_t *p_local;
  
  local_3c = 0;
  p_00 = Aig_ManLevelize(p);
  iVar1 = Aig_ManObjNumMax(p);
  p_01 = Vec_IntStart(iVar1);
  Counter = Vec_VecSize(p_00);
  while (Counter = Counter + -1, -1 < Counter) {
    pVVar2 = Vec_VecEntry(p_00,Counter);
    local_38 = Vec_PtrSize(pVVar2);
    while (local_38 = local_38 + -1, -1 < local_38) {
      pVVar2 = Vec_VecEntry(p_00,Counter);
      pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(pVVar2,local_38);
      iVar1 = Aig_ObjId(pObj_00);
      Vec_IntWriteEntry(p_01,iVar1,local_3c / nPartSize);
      local_3c = local_3c + 1;
    }
  }
  Vec_VecFree(p_00);
  return p_01;
}

Assistant:

Vec_Int_t * Aig_ManPartitionLevelized( Aig_Man_t * p, int nPartSize )
{
    Vec_Int_t * vId2Part;
    Vec_Vec_t * vNodes;
    Aig_Obj_t * pObj;
    int i, k, Counter = 0;
    vNodes = Aig_ManLevelize( p );
    vId2Part = Vec_IntStart( Aig_ManObjNumMax(p) );
    Vec_VecForEachEntryReverseReverse( Aig_Obj_t *, vNodes, pObj, i, k )
        Vec_IntWriteEntry( vId2Part, Aig_ObjId(pObj), Counter++/nPartSize );
    Vec_VecFree( vNodes );
    return vId2Part;
}